

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

optional<long> __thiscall
node::anon_unknown_2::ChainImpl::calculateCombinedBumpFee
          (ChainImpl *this,vector<COutPoint,_std::allocator<COutPoint>_> *outpoints,
          CFeeRate *target_feerate)

{
  _Storage<long,_true> _Var1;
  undefined8 unaff_RBX;
  ulong uVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  MiniMiner local_1a0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_node->mempool)._M_t.
      super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    uVar2 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    _Var1._M_value = 0;
  }
  else {
    MiniMiner::MiniMiner
              (&local_1a0,
               (this->m_node->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,outpoints);
    oVar3 = MiniMiner::CalculateTotalBumpFees(&local_1a0,target_feerate);
    _Var1._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    uVar2 = (ulong)oVar3.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._8_4_;
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
    ::~_Rb_tree(&local_1a0.m_descendant_set_by_txid._M_t);
    if (local_1a0.m_entries.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.m_entries.
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.m_entries.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.m_entries.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
    ::~_Rb_tree(&local_1a0.m_entries_by_txid._M_t);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&local_1a0.m_in_block._M_t);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
    ::~_Rb_tree(&local_1a0.m_bump_fees._M_t);
    std::
    _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_1a0.m_inclusion_order._M_t);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
    ::~_Rb_tree(&local_1a0.m_requested_outpoints_by_txid._M_t);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&local_1a0.m_to_be_replaced._M_t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar2 & 0xffffffff;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var1._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> calculateCombinedBumpFee(const std::vector<COutPoint>& outpoints, const CFeeRate& target_feerate) override
    {
        if (!m_node.mempool) {
            return 0;
        }
        return MiniMiner(*m_node.mempool, outpoints).CalculateTotalBumpFees(target_feerate);
    }